

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O0

bool __thiscall ZAP::Archive::openMemory(Archive *this,char *data,size_t size)

{
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  _Ios_Openmode _Var4;
  istringstream *this_00;
  allocator local_41;
  string local_40 [32];
  ulong local_20;
  size_t size_local;
  char *data_local;
  Archive *this_local;
  
  local_20 = size;
  size_local = (size_t)data;
  data_local = (char *)this;
  this_00 = (istringstream *)operator_new(0x180);
  sVar2 = size_local;
  uVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,(char *)sVar2,uVar1,&local_41);
  _Var4 = std::operator|(_S_in,_S_bin);
  std::__cxx11::istringstream::istringstream(this_00,local_40,_Var4);
  this->stream = (istream *)this_00;
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  bVar3 = loadStream(this);
  return bVar3;
}

Assistant:

bool Archive::openMemory(const char *data, std::size_t size)
	{
		stream = new std::istringstream(std::string(data, size), std::ios::in | std::ios::binary);
		return loadStream();
	}